

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall
RuntimeFunctionAnalyser::visit(RuntimeFunctionAnalyser *this,RuntimeFunctionSymbol *symbol)

{
  this->symbolValid_ = true;
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::operator=(&this->arguments_,&symbol->arguments_);
  (this->returnType_).super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName> =
       (_Optional_payload_base<TypeName>)((ulong)symbol->returnType_ | 0x100000000);
  std::__shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>,
             &(symbol->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void RuntimeFunctionAnalyser::visit(RuntimeFunctionSymbol& symbol)
{
  symbolValid_ = true;
  arguments_ = symbol.getArguments();
  returnType_ = symbol.getReturnType();
  body_ = symbol.getBody();
}